

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
* __thiscall
pstore::region::factory::create<pstore::file::in_memory,pstore::in_memory_mapper>
          (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           *__return_storage_ptr__,factory *this,shared_ptr<pstore::file::in_memory> *file)

{
  uint64_t bytes_to_map;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> builder;
  shared_ptr<pstore::file::in_memory> local_48;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> local_38;
  
  local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bytes_to_map = (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->eof_;
  local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
         ._M_pi;
  if (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::region_builder
            (&local_38,&local_48,this->full_size_,this->min_size_);
  if (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::operator()
            (__return_storage_ptr__,&local_38,bytes_to_map);
  if (local_38.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.file_.
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto factory::create (std::shared_ptr<File> file) -> std::vector<memory_mapper_ptr> {

            // There's no lock on the file when we call the size() method here. However, the file
            // is only allowed to grow so if it changes then the worst outcome is that we end up
            // memory mapping more of it beyond the logical size.

            std::uint64_t const file_size = file->size ();
            region_builder<File, MemoryMapper> builder (file, this->full_size (),
                                                        this->min_size ());
            return builder (file_size);
        }